

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypePrinter.cpp
# Opt level: O2

string * __thiscall
slang::ast::TypeArgFormatter::format_abi_cxx11_
          (string *__return_storage_ptr__,TypeArgFormatter *this,any *arg)

{
  Type *type;
  pair<ska::detailv3::sherwood_v3_table<const_slang::ast::Type_*,_const_slang::ast::Type_*,_slang::Hasher<const_slang::ast::Type_*>,_ska::detailv3::functor_storage<unsigned_long,_slang::Hasher<const_slang::ast::Type_*>_>,_std::equal_to<const_slang::ast::Type_*>,_ska::detailv3::functor_storage<bool,_std::equal_to<const_slang::ast::Type_*>_>,_std::allocator<const_slang::ast::Type_*>,_std::allocator<ska::detailv3::sherwood_v3_entry<const_slang::ast::Type_*>_>_>::templated_iterator<const_slang::ast::Type_*>,_bool>
  pVar1;
  Type *local_28;
  
  type = std::any_cast<slang::ast::Type_const*>(arg);
  local_28 = type;
  pVar1 = ska::detailv3::
          sherwood_v3_table<slang::ast::Type_const*,slang::ast::Type_const*,slang::Hasher<slang::ast::Type_const*>,ska::detailv3::functor_storage<unsigned_long,slang::Hasher<slang::ast::Type_const*>>,std::equal_to<slang::ast::Type_const*>,ska::detailv3::functor_storage<bool,std::equal_to<slang::ast::Type_const*>>,std::allocator<slang::ast::Type_const*>,std::allocator<ska::detailv3::sherwood_v3_entry<slang::ast::Type_const*>>>
          ::emplace<slang::ast::Type_const*>
                    ((sherwood_v3_table<slang::ast::Type_const*,slang::ast::Type_const*,slang::Hasher<slang::ast::Type_const*>,ska::detailv3::functor_storage<unsigned_long,slang::Hasher<slang::ast::Type_const*>>,std::equal_to<slang::ast::Type_const*>,ska::detailv3::functor_storage<bool,std::equal_to<slang::ast::Type_const*>>,std::allocator<slang::ast::Type_const*>,std::allocator<ska::detailv3::sherwood_v3_entry<slang::ast::Type_const*>>>
                      *)&this->seenTypes,&local_28);
  (this->printer).options.printAKA = (bool)(pVar1.second & 1);
  *(size_t *)
   ((long)&(((this->printer).buffer._M_t.
             super___uniq_ptr_impl<slang::FormatBuffer,_std::default_delete<slang::FormatBuffer>_>.
             _M_t.
             super__Tuple_impl<0UL,_slang::FormatBuffer_*,_std::default_delete<slang::FormatBuffer>_>
             .super__Head_base<0UL,_slang::FormatBuffer_*,_false>._M_head_impl)->buf).
           super_buffer<char> + 0x10) = 0;
  TypePrinter::append(&this->printer,type);
  TypePrinter::toString_abi_cxx11_(__return_storage_ptr__,&this->printer);
  return __return_storage_ptr__;
}

Assistant:

std::string TypeArgFormatter::format(const std::any& arg) {
    const Type& type = *std::any_cast<const Type*>(arg);
    bool unique = seenTypes.insert(&type).second;
    printer.options.printAKA = unique;

    printer.clear();
    printer.append(type);
    return printer.toString();
}